

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsHasIndexedPropertiesExternalData(JsValueRef object,bool *value)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *this;
  DynamicObject *this_00;
  Type typeId;
  DebugCheckNoException local_30;
  DebugCheckNoException __debugCheckNoException;
  
  if (object == (JsValueRef)0x0) {
    return JsErrorInvalidArgument;
  }
  if (value == (bool *)0x0) {
    return JsErrorNullArgument;
  }
  local_30.hasException = true;
  local_30.__exceptionCheck = ExceptionCheck::Save();
  *value = false;
  if (((ulong)object & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)object & 0xffff000000000000) != 0x1000000000000) {
    typeId = TypeIds_FirstNumberType;
    if ((((ulong)object & 0xffff000000000000) == 0x1000000000000) ||
       (typeId = TypeIds_Number, (ulong)object >> 0x32 != 0)) goto LAB_0037a85c;
    this = Js::UnsafeVarTo<Js::RecyclableObject>(object);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                         ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_0037a902;
      *puVar4 = 0;
    }
    typeId = ((this->type).ptr)->typeId;
    if (((int)typeId < 0x58) || (BVar3 = Js::RecyclableObject::IsExternal(this), BVar3 != 0))
    goto LAB_0037a85c;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                       ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                       "GetTypeId aValue has invalid TypeId");
    if (!bVar2) goto LAB_0037a902;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/TaggedInt.inl"
                       ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                       "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) {
LAB_0037a902:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    typeId = TypeIds_FirstNumberType;
  }
  *puVar4 = 0;
LAB_0037a85c:
  bVar2 = Js::DynamicType::Is(typeId);
  if (bVar2) {
    this_00 = Js::UnsafeVarTo<Js::DynamicObject>(object);
    bVar2 = Js::DynamicObject::HasObjectArray(this_00);
    if (bVar2 && this_00->field_1 != (anon_union_8_2_815e7e51_for_DynamicObject_2)0x0) {
      bVar2 = Js::DynamicObject::IsAnyArray((DynamicObject *)this_00->field_1);
      bVar2 = !bVar2;
    }
    else {
      bVar2 = false;
    }
    *value = bVar2;
  }
  local_30.hasException = false;
  DebugCheckNoException::~DebugCheckNoException(&local_30);
  return JsNoError;
}

Assistant:

CHAKRA_API JsHasIndexedPropertiesExternalData(_In_ JsValueRef object, _Out_ bool *value)
{
    VALIDATE_JSREF(object);
    PARAM_NOT_NULL(value);

    BEGIN_JSRT_NO_EXCEPTION
    {
        *value = false;

        if (Js::DynamicType::Is(Js::JavascriptOperators::GetTypeId(object)))
        {
            Js::DynamicObject* dynamicObject = Js::UnsafeVarTo<Js::DynamicObject>(object);
            Js::ArrayObject* objectArray = dynamicObject->GetObjectArray();
            *value = (objectArray && !Js::DynamicObject::IsAnyArray(objectArray));
        }
    }